

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *centre,float radius,ImU32 col,int num_segments,float thickness)

{
  float a_max;
  float thickness_local;
  int num_segments_local;
  ImU32 col_local;
  float radius_local;
  ImVec2 *centre_local;
  ImDrawList *this_local;
  
  if (col >> 0x18 != 0) {
    PathArcTo(this,centre,radius - 0.5,0.0,
              (((float)num_segments - 1.0) * 6.2831855) / (float)num_segments,num_segments);
    PathStroke(this,col,true,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& centre, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col >> 24) == 0)
        return;

    const float a_max = IM_PI*2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(centre, radius-0.5f, 0.0f, a_max, num_segments);
    PathStroke(col, true, thickness);
}